

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::BeginDragDropSource(ImGuiDragDropFlags flags)

{
  ImGuiItemStatusFlags *pIVar1;
  ImRect *r_abs;
  float fVar2;
  float fVar3;
  ImGuiWindow *pIVar4;
  ImGuiContext *pIVar5;
  bool bVar6;
  ImGuiID id;
  ImGuiContext *g;
  ImGuiWindow *this;
  uint uVar7;
  
  pIVar5 = GImGui;
  if ((flags & 0x10U) == 0) {
    this = GImGui->CurrentWindow;
    id = (this->DC).LastItemId;
    if (id == 0) {
      if ((flags & 8U) == 0) {
        return false;
      }
      if ((GImGui->IO).MouseDown[0] == false) {
        return false;
      }
      if ((((this->DC).LastItemStatusFlags & 1) != 0) ||
         ((GImGui->ActiveId != 0 && (GImGui->ActiveIdWindow == this)))) {
        r_abs = &(this->DC).LastItemRect;
        id = ImGuiWindow::GetIDFromRectangle(this,r_abs);
        (this->DC).LastItemId = id;
        bVar6 = ItemHoverable(r_abs,id);
        if ((bVar6) && ((pIVar5->IO).MouseClicked[0] == true)) {
          SetActiveID(id,this);
          FocusWindow(this);
        }
        if (pIVar5->ActiveId == id) goto LAB_0011f691;
      }
    }
    else if (GImGui->ActiveId == id) {
      bVar6 = false;
      if ((GImGui->IO).MouseDown[0] == false) {
        return false;
      }
LAB_0011f691:
      pIVar5->ActiveIdAllowOverlap = bVar6;
      if ((GImGui->IO).MouseDown[0] == false) {
        pIVar5->ActiveIdUsingNavDirMask = 0xffffffff;
        pIVar5->ActiveIdUsingNavInputMask = 0xffffffff;
        pIVar5->ActiveIdUsingKeyInputMask = 0xffffffffffffffff;
      }
      else {
        uVar7 = (this->IDStack).Data[(long)(this->IDStack).Size + -1];
        fVar2 = (GImGui->IO).MouseDragThreshold;
        fVar3 = (GImGui->IO).MouseDragMaxDistanceSqr[0];
        pIVar5->ActiveIdUsingNavDirMask = 0xffffffff;
        pIVar5->ActiveIdUsingNavInputMask = 0xffffffff;
        pIVar5->ActiveIdUsingKeyInputMask = 0xffffffffffffffff;
        if (fVar2 * fVar2 <= fVar3) goto LAB_0011f547;
      }
    }
    bVar6 = false;
  }
  else {
    this = (ImGuiWindow *)0x0;
    id = ImHashStr("#SourceExtern",0,0);
    uVar7 = 0;
LAB_0011f547:
    if (pIVar5->DragDropActive == false) {
      ClearDragDrop();
      (pIVar5->DragDropPayload).SourceId = id;
      (pIVar5->DragDropPayload).SourceParentId = uVar7;
      pIVar5->DragDropActive = true;
      pIVar5->DragDropSourceFlags = flags;
      pIVar5->DragDropMouseButton = 0;
      if (id == pIVar5->ActiveId) {
        pIVar5->ActiveIdNoClearOnFocusLoss = true;
      }
    }
    pIVar5->DragDropSourceFrameCount = pIVar5->FrameCount;
    pIVar5->DragDropWithinSource = true;
    if ((((flags & 1U) == 0) && (BeginTooltip(), pIVar5->DragDropAcceptIdPrev != 0)) &&
       ((pIVar5->DragDropAcceptFlags & 0x1000) != 0)) {
      pIVar4 = pIVar5->CurrentWindow;
      pIVar4->SkipItems = true;
      pIVar4->HiddenFramesCanSkipItems = '\x01';
    }
    bVar6 = true;
    if ((flags & 0x12U) == 0) {
      pIVar1 = &(this->DC).LastItemStatusFlags;
      *(byte *)pIVar1 = (byte)*pIVar1 & 0xfe;
    }
  }
  return bVar6;
}

Assistant:

bool ImGui::BeginDragDropSource(ImGuiDragDropFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    bool source_drag_active = false;
    ImGuiID source_id = 0;
    ImGuiID source_parent_id = 0;
    ImGuiMouseButton mouse_button = ImGuiMouseButton_Left;
    if (!(flags & ImGuiDragDropFlags_SourceExtern))
    {
        source_id = window->DC.LastItemId;
        if (source_id != 0 && g.ActiveId != source_id) // Early out for most common case
            return false;
        if (g.IO.MouseDown[mouse_button] == false)
            return false;

        if (source_id == 0)
        {
            // If you want to use BeginDragDropSource() on an item with no unique identifier for interaction, such as Text() or Image(), you need to:
            // A) Read the explanation below, B) Use the ImGuiDragDropFlags_SourceAllowNullID flag, C) Swallow your programmer pride.
            if (!(flags & ImGuiDragDropFlags_SourceAllowNullID))
            {
                IM_ASSERT(0);
                return false;
            }

            // Early out
            if ((window->DC.LastItemStatusFlags & ImGuiItemStatusFlags_HoveredRect) == 0 && (g.ActiveId == 0 || g.ActiveIdWindow != window))
                return false;

            // Magic fallback (=somehow reprehensible) to handle items with no assigned ID, e.g. Text(), Image()
            // We build a throwaway ID based on current ID stack + relative AABB of items in window.
            // THE IDENTIFIER WON'T SURVIVE ANY REPOSITIONING OF THE WIDGET, so if your widget moves your dragging operation will be canceled.
            // We don't need to maintain/call ClearActiveID() as releasing the button will early out this function and trigger !ActiveIdIsAlive.
            source_id = window->DC.LastItemId = window->GetIDFromRectangle(window->DC.LastItemRect);
            bool is_hovered = ItemHoverable(window->DC.LastItemRect, source_id);
            if (is_hovered && g.IO.MouseClicked[mouse_button])
            {
                SetActiveID(source_id, window);
                FocusWindow(window);
            }
            if (g.ActiveId == source_id) // Allow the underlying widget to display/return hovered during the mouse release frame, else we would get a flicker.
                g.ActiveIdAllowOverlap = is_hovered;
        }
        else
        {
            g.ActiveIdAllowOverlap = false;
        }
        if (g.ActiveId != source_id)
            return false;
        source_parent_id = window->IDStack.back();
        source_drag_active = IsMouseDragging(mouse_button);

        // Disable navigation and key inputs while dragging
        g.ActiveIdUsingNavDirMask = ~(ImU32)0;
        g.ActiveIdUsingNavInputMask = ~(ImU32)0;
        g.ActiveIdUsingKeyInputMask = ~(ImU64)0;
    }
    else
    {
        window = NULL;
        source_id = ImHashStr("#SourceExtern");
        source_drag_active = true;
    }

    if (source_drag_active)
    {
        if (!g.DragDropActive)
        {
            IM_ASSERT(source_id != 0);
            ClearDragDrop();
            ImGuiPayload& payload = g.DragDropPayload;
            payload.SourceId = source_id;
            payload.SourceParentId = source_parent_id;
            g.DragDropActive = true;
            g.DragDropSourceFlags = flags;
            g.DragDropMouseButton = mouse_button;
            if (payload.SourceId == g.ActiveId)
                g.ActiveIdNoClearOnFocusLoss = true;
        }
        g.DragDropSourceFrameCount = g.FrameCount;
        g.DragDropWithinSource = true;

        if (!(flags & ImGuiDragDropFlags_SourceNoPreviewTooltip))
        {
            // Target can request the Source to not display its tooltip (we use a dedicated flag to make this request explicit)
            // We unfortunately can't just modify the source flags and skip the call to BeginTooltip, as caller may be emitting contents.
            BeginTooltip();
            if (g.DragDropAcceptIdPrev && (g.DragDropAcceptFlags & ImGuiDragDropFlags_AcceptNoPreviewTooltip))
            {
                ImGuiWindow* tooltip_window = g.CurrentWindow;
                tooltip_window->SkipItems = true;
                tooltip_window->HiddenFramesCanSkipItems = 1;
            }
        }

        if (!(flags & ImGuiDragDropFlags_SourceNoDisableHover) && !(flags & ImGuiDragDropFlags_SourceExtern))
            window->DC.LastItemStatusFlags &= ~ImGuiItemStatusFlags_HoveredRect;

        return true;
    }
    return false;
}